

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::CompleteCubeExtraLevelCase::createTexture(CompleteCubeExtraLevelCase *this)

{
  GLsizei height;
  int iVar1;
  int iVar2;
  GLenum GVar3;
  int *piVar4;
  void *pvVar5;
  RGBA local_fc;
  PixelBufferAccess local_f8;
  int local_cc;
  int targetNdx_1;
  int local_a0;
  GLsizei local_9c;
  int targetNdx;
  int levelH;
  int levelW;
  int levelNdx;
  PixelBufferAccess local_80;
  int local_58;
  int numLevels;
  GLuint local_44;
  undefined1 local_40 [4];
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  CompleteCubeExtraLevelCase *this_local;
  
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_40,(TextureFormat *)&levelData.m_data.m_cap)
  ;
  glwGenTextures(1,&local_44);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,local_44);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  piVar4 = tcu::Vector<int,_2>::x
                     ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
  iVar1 = deLog2Floor32(*piVar4);
  piVar4 = tcu::Vector<int,_2>::y
                     ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
  iVar2 = deLog2Floor32(*piVar4);
  local_58 = de::max<int>(iVar1,iVar2);
  local_58 = local_58 + 1;
  piVar4 = tcu::Vector<int,_2>::x
                     ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y
                     ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
  tcu::TextureLevel::setSize((TextureLevel *)local_40,iVar1,*piVar4,1);
  tcu::TextureLevel::getAccess(&local_80,(TextureLevel *)local_40);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&levelW,0.0,0.0,1.0,1.0);
  tcu::clear(&local_80,(Vec4 *)&levelW);
  for (levelH = 0; levelH < local_58; levelH = levelH + 1) {
    piVar4 = tcu::Vector<int,_2>::x
                       ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
    targetNdx = de::max<int>(1,*piVar4 >> ((byte)levelH & 0x1f));
    piVar4 = tcu::Vector<int,_2>::y
                       ((Vector<int,_2> *)&(this->super_TexCubeCompletenessCase).field_0x84);
    local_9c = de::max<int>(1,*piVar4 >> ((byte)levelH & 0x1f));
    for (local_a0 = 0; iVar2 = levelH, iVar1 = targetNdx, height = local_9c, local_a0 < 6;
        local_a0 = local_a0 + 1) {
      GVar3 = *(GLenum *)(s_cubeTargets + (long)local_a0 * 4);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&stack0xffffffffffffff38,(TextureLevel *)local_40);
      pvVar5 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&stack0xffffffffffffff38);
      glwTexImage2D(GVar3,iVar2,0x1908,iVar1,height,0,0x1908,0x1401,pvVar5);
    }
  }
  for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
    GVar3 = *(GLenum *)(s_cubeTargets + (long)local_cc * 4);
    iVar1 = local_58 + 1;
    tcu::TextureLevel::getAccess(&local_f8,(TextureLevel *)local_40);
    pvVar5 = tcu::PixelBufferAccess::getDataPtr(&local_f8);
    glwTexImage2D(GVar3,iVar1,0x1908,1,1,0,0x1908,0x1401,pvVar5);
  }
  tcu::RGBA::RGBA(&local_fc,0,0,0xff,0xff);
  (this->super_TexCubeCompletenessCase).m_compareColor.m_value = local_fc.m_value;
  GVar3 = glwGetError();
  glu::checkError(GVar3,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x378);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_40);
  return;
}

Assistant:

void CompleteCubeExtraLevelCase::createTexture (void)
{
	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
			glTexImage2D(s_cubeTargets[targetNdx], levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	// Specify extra level.
	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		glTexImage2D(s_cubeTargets[targetNdx], numLevels+1, GL_RGBA, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	m_compareColor = RGBA(0,0,255,255);

	GLU_CHECK_MSG("Set texturing state");
}